

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeIDMap.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMNodeIDMap::DOMNodeIDMap(DOMNodeIDMap *this,XMLSize_t initialSize,DOMDocument *doc)

{
  int iVar1;
  RuntimeException *this_00;
  MemoryManager *memoryManager;
  undefined4 extraout_var;
  ulong uVar2;
  DOMNode *local_78;
  float local_64;
  DOMDocumentImpl *local_58;
  ulong local_38;
  XMLSize_t i;
  DOMDocument *doc_local;
  XMLSize_t initialSize_local;
  DOMNodeIDMap *this_local;
  
  this->fNumEntries = 0;
  this->fDoc = doc;
  this->fSizeIndex = 0;
  while( true ) {
    if (initialSize <= *(ulong *)(gPrimes + this->fSizeIndex * 8)) {
      this->fSize = *(XMLSize_t *)(gPrimes + this->fSizeIndex * 8);
      local_64 = (float)this->fSize;
      uVar2 = (ulong)(local_64 * 0.8);
      this->fMaxEntries = uVar2 | (long)(local_64 * 0.8 - 9.223372e+18) & (long)uVar2 >> 0x3f;
      if (this->fDoc == (DOMDocument *)0x0) {
        local_78 = (DOMNode *)0x0;
      }
      else {
        local_78 = &this->fDoc[-1].super_DOMNode;
      }
      iVar1 = (*local_78->_vptr_DOMNode[4])(local_78,this->fSize << 3);
      this->fTable = (DOMAttr **)CONCAT44(extraout_var,iVar1);
      for (local_38 = 0; local_38 < this->fSize; local_38 = local_38 + 1) {
        this->fTable[local_38] = (DOMAttr *)0x0;
      }
      return;
    }
    if (*(long *)(gPrimes + this->fSizeIndex * 8) == 0) break;
    this->fSizeIndex = this->fSizeIndex + 1;
  }
  this->fSizeIndex = this->fSizeIndex - 1;
  this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
  if (this->fDoc == (DOMDocument *)0x0) {
    local_58 = (DOMDocumentImpl *)0x0;
  }
  else {
    local_58 = (DOMDocumentImpl *)&this->fDoc[-1].super_DOMNode;
  }
  memoryManager = DOMDocumentImpl::getMemoryManager(local_58);
  RuntimeException::RuntimeException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/dom/impl/DOMNodeIDMap.cpp"
             ,0x31,NodeIDMap_GrowErr,memoryManager);
  __cxa_throw(this_00,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
}

Assistant:

DOMNodeIDMap::DOMNodeIDMap(XMLSize_t initialSize, DOMDocument *doc)
: fNumEntries(0)
, fDoc(doc)
{
    for (fSizeIndex = 0; gPrimes[fSizeIndex] < initialSize; fSizeIndex++)
    {
        if (gPrimes[fSizeIndex] == 0)
        {
            // We need a bigger size than the largest available one.
            //   Big trouble.
            fSizeIndex--;
            ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::NodeIDMap_GrowErr, ((DOMDocumentImpl *)fDoc)->getMemoryManager());
        }
    }

    fSize = gPrimes[fSizeIndex];
    fMaxEntries = (XMLSize_t)(float(fSize) * gMaxFill);

    //fTable = new (fDoc) DOMAttr*[fSize];
    fTable = (DOMAttr**) ((DOMDocumentImpl *)fDoc)->allocate(sizeof(DOMAttr*) * fSize);
    XMLSize_t i;
    for (i=0; i<fSize; i++)
        fTable[i] = 0;
}